

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

void FAudioVoice_GetChannelVolumes(FAudioVoice *voice,uint32_t Channels,float *pVolumes)

{
  FAudio_PlatformLockMutex(voice->volumeLock);
  SDL_memcpy(pVolumes,voice->channelVolume,(ulong)Channels << 2);
  FAudio_PlatformUnlockMutex(voice->volumeLock);
  return;
}

Assistant:

void FAudioVoice_GetChannelVolumes(
	FAudioVoice *voice,
	uint32_t Channels,
	float *pVolumes
) {
	LOG_API_ENTER(voice->audio)
	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)
	FAudio_memcpy(
		pVolumes,
		voice->channelVolume,
		sizeof(float) * Channels
	);
	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
	LOG_API_EXIT(voice->audio)
}